

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2max_distance_targets.cc
# Opt level: O0

S2Cap * __thiscall
S2MaxDistanceShapeIndexTarget::GetCapBound
          (S2Cap *__return_storage_ptr__,S2MaxDistanceShapeIndexTarget *this)

{
  S2Point *a;
  S1ChordAngle radius;
  D local_90;
  S2ShapeIndexRegion<S2ShapeIndex> local_68;
  undefined1 local_40 [8];
  S2Cap cap;
  S2MaxDistanceShapeIndexTarget *this_local;
  
  cap.radius_.length2_ = (double)this;
  MakeS2ShapeIndexRegion<S2ShapeIndex>(&local_68,this->index_);
  S2ShapeIndexRegion<S2ShapeIndex>::GetCapBound((S2Cap *)local_40,&local_68);
  S2ShapeIndexRegion<S2ShapeIndex>::~S2ShapeIndexRegion(&local_68);
  a = S2Cap::center((S2Cap *)local_40);
  util::math::internal_vector::operator-(&local_90,a);
  radius = S2Cap::radius((S2Cap *)local_40);
  S2Cap::S2Cap(__return_storage_ptr__,&local_90,radius);
  S2Cap::~S2Cap((S2Cap *)local_40);
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2MaxDistanceShapeIndexTarget::GetCapBound() {
  S2Cap cap = MakeS2ShapeIndexRegion(index_).GetCapBound();
  return S2Cap(-cap.center(), cap.radius());
}